

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  byte bVar1;
  uchar *puVar2;
  long lVar3;
  void *pvVar4;
  undefined4 in_register_00000084;
  uchar *puVar5;
  int iStack_40;
  uchar px [3];
  uchar local_29;
  uchar local_28;
  uchar local_27;
  uchar arr [3];
  uchar local_23 [3];
  
  puVar5 = (uchar *)CONCAT44(in_register_00000084,expand_mono);
  if (rgb_dir - 1U < 2) {
    if (write_alpha != 0) {
      local_29 = *puVar5;
      puVar2 = &local_29;
      local_28 = local_29;
      local_27 = local_29;
      goto LAB_0012f741;
    }
    pvVar4 = s->context;
    iStack_40 = 1;
    puVar2 = puVar5;
  }
  else {
    if (rgb_dir == 3) {
LAB_0012f713:
      px[2] = puVar5[2];
      px[0] = *puVar5;
      px[1] = puVar5[1];
      puVar2 = local_23;
    }
    else {
      if (rgb_dir != 4) goto LAB_0012f74a;
      if (comp != 0) goto LAB_0012f713;
      bVar1 = puVar5[3];
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        px[lVar3] = (char)((int)(((uint)puVar5[lVar3] - (uint)(byte)(&DAT_001ba6d0)[lVar3]) *
                                (uint)bVar1) / 0xff) + (&DAT_001ba6d0)[lVar3];
      }
      puVar2 = arr;
    }
    *puVar2 = px[2];
    puVar2[1] = px[1];
    puVar2[2] = px[0];
LAB_0012f741:
    pvVar4 = s->context;
    iStack_40 = 3;
  }
  (*s->func)(pvVar4,puVar2,iStack_40);
LAB_0012f74a:
  if (0 < comp) {
    (*s->func)(s->context,puVar5 + (long)rgb_dir + -1,1);
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      s->func(s->context, &d[comp - 1], 1);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            s->func(s->context, d, 1);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      s->func(s->context, &d[comp - 1], 1);
}